

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueWriter.hpp
# Opt level: O3

size_t __thiscall binlog::detail::QueueWriter::maximizeWriteCapacity(QueueWriter *this)

{
  ulong uVar1;
  ulong uVar2;
  Queue *pQVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar1 = (this->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i;
  uVar2 = (this->_queue->readIndex).super___atomic_base<unsigned_long>._M_i;
  pQVar3 = this->_queue;
  if (uVar1 < uVar2) {
    pcVar5 = pQVar3->buffer;
    pcVar6 = pcVar5 + uVar1;
    this->_writePos = pcVar6;
    pcVar5 = pcVar5 + (uVar2 - 1);
  }
  else {
    sVar4 = pQVar3->capacity;
    if ((long)(sVar4 - uVar1) < (long)(uVar2 - 1)) {
      pQVar3->dataEnd = uVar1;
      pcVar6 = pQVar3->buffer;
      this->_writePos = pcVar6;
      pcVar5 = pcVar6 + (uVar2 - 1);
    }
    else {
      pcVar5 = pQVar3->buffer;
      pcVar6 = pcVar5 + uVar1;
      this->_writePos = pcVar6;
      pcVar5 = pcVar5 + sVar4;
    }
  }
  this->_writeEnd = pcVar5;
  return (long)pcVar5 - (long)pcVar6;
}

Assistant:

std::size_t maximizeWriteCapacity()
  {
    const std::size_t w = _queue->writeIndex.load(std::memory_order_relaxed);
    const std::size_t r = _queue->readIndex.load(std::memory_order_acquire);

    if (w < r) // [####W.....R###E..]
    {
      _writePos = buffer() + w;
      _writeEnd = buffer() + r - 1;
    }
    else // [...R###W......]
    {
      const std::int64_t rightSize = std::int64_t(_queue->capacity - w);
      const std::int64_t leftSize = std::int64_t(r) - 1;

      if (rightSize >= leftSize)
      {
        _writePos = buffer() + w;
        _writeEnd = buffer() + w + rightSize;
      }
      else
      {
        _queue->dataEnd = w;
        _writePos = buffer();
        _writeEnd = buffer() + leftSize;
      }
    }

    return writeCapacity();
  }